

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  PS_TableRec *pPVar1;
  PS_TableRec *pPVar2;
  byte bVar3;
  FT_Memory pFVar4;
  FT_Byte *pFVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong __n;
  bool bVar8;
  FT_Byte *pFVar9;
  FT_UInt FVar10;
  uint uVar11;
  int iVar12;
  FT_Error FVar13;
  FT_Pointer __dest;
  uint uVar15;
  long lVar16;
  byte *pbVar17;
  ulong uVar18;
  FT_Byte *local_80;
  FT_Byte *base;
  undefined8 *local_70;
  T1_Face local_68;
  undefined8 local_60;
  FT_Byte notdef_glyph [5];
  int local_3c;
  int local_38;
  FT_Error local_34;
  FT_Long FVar14;
  
  pFVar4 = (loader->parser).root.memory;
  local_70 = (undefined8 *)face->psaux;
  pFVar5 = (loader->parser).root.cursor;
  pbVar6 = (loader->parser).root.limit;
  FVar14 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  uVar11 = (uint)FVar14;
  FVar13 = 3;
  if (-1 < (int)uVar11) {
    lVar16 = (long)pbVar6 - (long)pFVar5 >> 3;
    uVar15 = (uint)lVar16;
    if ((long)(ulong)(uVar11 & 0x7fffffff) <= lVar16) {
      uVar15 = uVar11;
    }
    if (uVar15 == 0) {
      return;
    }
    if ((loader->parser).root.error != 0) {
      return;
    }
    pPVar1 = &loader->charstrings;
    pPVar2 = &loader->glyph_names;
    base = (FT_Byte *)&loader->swap_table;
    local_68 = face;
    _notdef_glyph = pFVar4;
    if (loader->num_glyphs == 0) {
      FVar13 = (**(code **)*local_70)(pPVar1,uVar15 + 6,pFVar4);
      if (((FVar13 != 0) ||
          (FVar13 = (**(code **)*local_70)(pPVar2,uVar15 + 6,_notdef_glyph), FVar13 != 0)) ||
         (FVar13 = (**(code **)*local_70)(base,4,_notdef_glyph), FVar13 != 0)) goto LAB_0023420e;
      local_34 = 0;
    }
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pbVar17 = (loader->parser).root.cursor;
    if (pbVar17 < pbVar6) {
      local_38 = 0;
      bVar8 = false;
      local_3c = 0;
      do {
        if (pbVar17 + 3 < pbVar6) {
          bVar3 = pbVar17[3];
          if ((((ulong)bVar3 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
             || ((bVar3 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar3 - 0x5b) & 0x3f) & 1) != 0)
                 ))) {
            if (*pbVar17 == 0x65) {
              if ((pbVar17[1] == 0x6e) && (pbVar17[2] == 100)) break;
            }
            else if ((*pbVar17 == 100) &&
                    (((pbVar17[1] == 0x65 && (pbVar17[2] == 0x66)) && (local_38 != 0))))
            goto LAB_00233f02;
          }
        }
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        pbVar7 = (loader->parser).root.cursor;
        if (pbVar6 <= pbVar7) goto LAB_0023409d;
        if ((loader->parser).root.error != 0) {
          return;
        }
        if (*pbVar17 == 0x2f) {
          if (pbVar6 <= pbVar17 + 2) {
LAB_00234109:
            local_34 = 3;
            FVar13 = local_34;
            goto LAB_0023420e;
          }
          iVar12 = read_binary_data(&loader->parser,&local_60,&local_80,
                                    ((local_68->root).internal)->incremental_interface !=
                                    (FT_Incremental_InterfaceRec *)0x0);
          if (iVar12 == 0) {
            return;
          }
          if (loader->num_glyphs == 0) {
            pbVar17 = pbVar17 + 1;
            uVar18 = (long)pbVar7 - (long)pbVar17;
            local_34 = (*(loader->glyph_names).funcs.add)(pPVar2,local_38,pbVar17,(int)uVar18 + 1);
            FVar13 = local_34;
            if (local_34 != 0) goto LAB_0023420e;
            (loader->glyph_names).elements[local_38][uVar18 & 0xffffffff] = '\0';
            if ((*pbVar17 == 0x2e) &&
               (iVar12 = strcmp(".notdef",(char *)(loader->glyph_names).elements[local_38]),
               iVar12 == 0)) {
              bVar8 = true;
              local_3c = local_38;
            }
            FVar10 = (FT_UInt)local_60;
            uVar18 = (ulong)(local_68->type1).private_dict.lenIV;
            if (((long)uVar18 < 0) || ((int)(uVar15 + 5) <= local_38)) {
              local_34 = (*(loader->charstrings).funcs.add)
                                   (pPVar1,local_38,local_80,(FT_UInt)local_60);
            }
            else {
              __n = CONCAT44(local_60._4_4_,(FT_UInt)local_60);
              if (__n <= uVar18) goto LAB_00234109;
              __dest = ft_mem_alloc(_notdef_glyph,__n,&local_34);
              FVar13 = local_34;
              if (local_34 != 0) goto LAB_0023420e;
              memcpy(__dest,local_80,__n);
              (*(code *)local_70[4])(__dest,__n,0x10ea);
              iVar12 = (local_68->type1).private_dict.lenIV;
              local_34 = (*(loader->charstrings).funcs.add)
                                   (pPVar1,local_38,(void *)((long)__dest + (long)iVar12),
                                    FVar10 - iVar12);
              ft_mem_free(_notdef_glyph,__dest);
            }
            FVar13 = local_34;
            if (local_34 != 0) goto LAB_0023420e;
            local_38 = local_38 + (uint)(local_34 == 0);
          }
        }
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        pbVar17 = (loader->parser).root.cursor;
      } while (pbVar17 < pbVar6);
      FVar13 = 3;
      if (local_38 != 0) {
LAB_00233f02:
        pFVar5 = base;
        loader->num_glyphs = local_38;
        if (bVar8) {
          pFVar5 = *(loader->glyph_names).elements;
          iVar12 = strcmp(".notdef",(char *)pFVar5);
          pFVar9 = base;
          if (iVar12 == 0) {
            return;
          }
          FVar13 = (*(loader->swap_table).funcs.add)
                             ((PS_Table)base,0,pFVar5,*(loader->glyph_names).lengths);
          if ((FVar13 == 0) &&
             (local_34 = FVar13,
             FVar13 = (*(loader->swap_table).funcs.add)
                                ((PS_Table)pFVar9,1,*(loader->charstrings).elements,
                                 *(loader->charstrings).lengths), FVar13 == 0)) {
            lVar16 = (long)local_3c;
            local_34 = FVar13;
            FVar13 = (*(loader->swap_table).funcs.add)
                               ((PS_Table)pFVar9,2,(loader->glyph_names).elements[lVar16],
                                (loader->glyph_names).lengths[lVar16]);
            if (((FVar13 == 0) &&
                (((local_34 = FVar13,
                  FVar13 = (*(loader->swap_table).funcs.add)
                                     ((PS_Table)pFVar9,3,(loader->charstrings).elements[lVar16],
                                      (loader->charstrings).lengths[lVar16]), FVar13 == 0 &&
                  (local_34 = FVar13,
                  FVar13 = (*(loader->glyph_names).funcs.add)
                                     (pPVar2,local_3c,*(loader->swap_table).elements,
                                      *(loader->swap_table).lengths), FVar13 == 0)) &&
                 (local_34 = FVar13,
                 FVar13 = (*(loader->charstrings).funcs.add)
                                    (pPVar1,local_3c,(loader->swap_table).elements[1],
                                     (loader->swap_table).lengths[1]), FVar13 == 0)))) &&
               ((local_34 = FVar13,
                FVar13 = (*(loader->glyph_names).funcs.add)
                                   (pPVar2,0,(loader->swap_table).elements[2],
                                    (loader->swap_table).lengths[2]), FVar13 == 0 &&
                (local_34 = FVar13,
                FVar13 = (*(loader->charstrings).funcs.add)
                                   (pPVar1,0,(loader->swap_table).elements[3],
                                    (loader->swap_table).lengths[3]), FVar13 == 0)))) {
              return;
            }
          }
        }
        else {
          local_60._4_4_ = CONCAT31(local_60._5_3_,0xe);
          local_60._0_4_ = 0xde1f78b;
          FVar13 = (*(loader->swap_table).funcs.add)
                             ((PS_Table)base,0,*(loader->glyph_names).elements,
                              *(loader->glyph_names).lengths);
          if (((((FVar13 == 0) &&
                (local_34 = FVar13,
                FVar13 = (*(loader->swap_table).funcs.add)
                                   ((PS_Table)pFVar5,1,*(loader->charstrings).elements,
                                    *(loader->charstrings).lengths), FVar13 == 0)) &&
               (local_34 = FVar13, FVar13 = (*(loader->glyph_names).funcs.add)(pPVar2,0,".notdef",8)
               , FVar13 == 0)) &&
              ((local_34 = FVar13, FVar13 = (*(loader->charstrings).funcs.add)(pPVar1,0,&local_60,5)
               , FVar13 == 0 &&
               (local_34 = FVar13,
               FVar13 = (*(loader->glyph_names).funcs.add)
                                  (pPVar2,local_38,*(loader->swap_table).elements,
                                   *(loader->swap_table).lengths), FVar13 == 0)))) &&
             (local_34 = FVar13,
             FVar13 = (*(loader->charstrings).funcs.add)
                                (pPVar1,local_38,(loader->swap_table).elements[1],
                                 (loader->swap_table).lengths[1]), FVar13 == 0)) {
            loader->num_glyphs = loader->num_glyphs + 1;
            return;
          }
        }
      }
    }
    else {
LAB_0023409d:
      FVar13 = 3;
    }
  }
LAB_0023420e:
  (loader->parser).root.error = FVar13;
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }